

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_ns_prefix_data
               (xmlpr_ctx *pctx,LY_VALUE_FORMAT format,void *prefix_data,uint32_t prefix_opts)

{
  long *plVar1;
  char *local_58;
  uint local_3c;
  uint32_t i;
  lyxml_ns *ns;
  ly_set *set;
  uint32_t prefix_opts_local;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  xmlpr_ctx *pctx_local;
  
  if (format == LY_VALUE_XML) {
    for (local_3c = 0; local_3c < *(uint *)((long)prefix_data + 4); local_3c = local_3c + 1) {
      plVar1 = *(long **)(*(long *)((long)prefix_data + 8) + (ulong)local_3c * 8);
      if (*plVar1 != 0) {
        if ((prefix_opts & 2) == 0) {
          local_58 = (char *)*plVar1;
        }
        else {
          local_58 = (char *)0x0;
        }
        xml_print_ns(pctx,(char *)plVar1[1],local_58,prefix_opts);
      }
    }
  }
  else {
    ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_xml.c",
           0xa5);
  }
  return;
}

Assistant:

static void
xml_print_ns_prefix_data(struct xmlpr_ctx *pctx, LY_VALUE_FORMAT format, void *prefix_data, uint32_t prefix_opts)
{
    const struct ly_set *set;
    const struct lyxml_ns *ns;
    uint32_t i;

    switch (format) {
    case LY_VALUE_XML:
        set = prefix_data;
        for (i = 0; i < set->count; ++i) {
            ns = set->objs[i];
            if (!ns->prefix) {
                /* default namespace is not for the element */
                continue;
            }

            xml_print_ns(pctx, ns->uri, (prefix_opts & LYXML_PREFIX_DEFAULT) ? NULL : ns->prefix, prefix_opts);
        }
        break;
    default:
        /* cannot be created */
        LOGINT(pctx->ctx);
    }
}